

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O0

void build_compound_diffwtd_mask_d16_inv_avx2
               (uint8_t *mask,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1,
               int src1_stride,int h,int w,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i v;
  uint uVar4;
  __m256i *in_RCX;
  long lVar5;
  int in_EDX;
  longlong extraout_RDX_00;
  __m256i *in_RSI;
  void *in_RDI;
  __m256i *__return_storage_ptr__;
  undefined1 *in_R8;
  int in_R9D;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  undefined1 auVar17 [64];
  __m128i alVar18;
  __m128i lo;
  __m128i hi;
  __m128i hi_00;
  __m128i v_00;
  int in_stack_00000008;
  __m256i m8GH;
  __m256i m8EF;
  __m256i m8CD_1;
  __m256i m8AB_1;
  __m256i m16H;
  __m256i m16G;
  __m256i m16F;
  __m256i m16E;
  __m256i m16D_1;
  __m256i m16C_1;
  __m256i m16B_3;
  __m256i m16A_3;
  __m256i s1H;
  __m256i s1G;
  __m256i s1F;
  __m256i s1E;
  __m256i s1D_2;
  __m256i s1C_2;
  __m256i s1B_4;
  __m256i s1A_4;
  __m256i s0H;
  __m256i s0G;
  __m256i s0F;
  __m256i s0E;
  __m256i s0D_2;
  __m256i s0C_2;
  __m256i s0B_4;
  __m256i s0A_4;
  __m256i m8CD;
  __m256i m8AB;
  __m256i m16D;
  __m256i m16C;
  __m256i m16B_2;
  __m256i m16A_2;
  __m256i s1D_1;
  __m256i s1C_1;
  __m256i s1B_3;
  __m256i s1A_3;
  __m256i s0D_1;
  __m256i s0C_1;
  __m256i s0B_3;
  __m256i s0A_3;
  __m256i m8_3;
  __m256i m16B_1;
  __m256i m16A_1;
  __m256i s1B_2;
  __m256i s1A_2;
  __m256i s0B_2;
  __m256i s0A_2;
  __m256i m8_2;
  __m256i m16B;
  __m256i m16A;
  __m256i s1B_1;
  __m256i s1A_1;
  __m256i s0B_1;
  __m256i s0A_1;
  __m256i m8_1;
  __m256i m16CD;
  __m256i m16AB;
  __m256i s1CD;
  __m256i s1AB;
  __m256i s0CD;
  __m256i s0AB;
  __m256i m8;
  __m256i m16;
  __m256i s1;
  __m256i s0;
  __m128i s1D;
  __m128i s1C;
  __m128i s1B;
  __m128i s1A;
  __m128i s0D;
  __m128i s0C;
  __m128i s0B;
  __m128i s0A;
  int i;
  __m256i y64;
  __m256i y38;
  __m256i _r;
  int mask_base;
  undefined8 in_stack_fffffffffffff1a0;
  undefined8 *puVar19;
  undefined8 in_stack_fffffffffffff1a8;
  undefined8 *puVar20;
  longlong in_stack_fffffffffffff1b0;
  undefined1 *puVar21;
  void *in_stack_fffffffffffff1c0;
  void *in_stack_fffffffffffff1c8;
  void *in_stack_fffffffffffff1d0;
  longlong local_d60;
  int round;
  __m256i *clip_diff;
  __m256i *mask_base_16;
  __m256i *round_const;
  __m256i local_d40;
  longlong lStack_d28;
  longlong local_d20;
  longlong lStack_d18;
  longlong lStack_d10;
  longlong lStack_d08;
  longlong local_d00;
  longlong lStack_cf8;
  longlong lStack_cf0;
  longlong lStack_ce8;
  longlong local_ce0;
  longlong lStack_cd8;
  longlong lStack_cd0;
  longlong lStack_cc8;
  longlong local_cc0;
  longlong lStack_cb8;
  longlong lStack_cb0;
  longlong lStack_ca8;
  longlong local_ca0;
  longlong lStack_c98;
  longlong lStack_c90;
  longlong lStack_c88;
  longlong local_c80;
  longlong lStack_c78;
  longlong lStack_c70;
  longlong lStack_c68;
  __m256i local_c60;
  __m256i local_c40;
  __m256i local_c20;
  __m256i local_c00;
  __m256i local_be0;
  __m256i local_bc0;
  __m256i local_ba0;
  __m256i local_b80;
  __m256i local_b60;
  __m256i local_b40;
  __m256i local_b20;
  __m256i local_b00;
  __m256i local_ae0;
  __m256i local_ac0;
  __m256i local_aa0;
  __m256i local_a80;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  __m256i local_a20;
  __m256i local_a00;
  __m256i local_9e0;
  __m256i local_9c0;
  __m256i local_9a0;
  __m256i local_980;
  __m256i local_960;
  __m256i local_940;
  __m256i local_920;
  __m256i local_900;
  __m256i local_8e0;
  __m256i local_8c0;
  undefined1 local_8a0 [32];
  __m256i local_880;
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  __m256i local_800;
  __m256i local_7e0;
  undefined1 local_7c0 [32];
  __m256i local_7a0;
  __m256i local_780;
  __m256i local_760;
  __m256i local_740;
  __m256i local_720;
  __m256i local_700;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  __m256i local_5e0;
  __m256i local_5c0;
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  int local_4e4;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined4 local_474;
  int local_470;
  int local_46c;
  __m256i *local_468;
  int local_45c;
  __m256i *local_458;
  void *local_450;
  undefined2 local_446;
  undefined2 local_444;
  ushort local_442;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  longlong local_3c0;
  longlong lStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  __m256i *local_3a0;
  __m256i *palStack_398;
  __m256i *palStack_390;
  longlong lStack_388;
  longlong local_380;
  longlong lStack_378;
  longlong lStack_370;
  longlong lStack_368;
  longlong local_360;
  longlong lStack_358;
  longlong lStack_350;
  longlong lStack_348;
  longlong local_340;
  longlong lStack_338;
  longlong lStack_330;
  longlong lStack_328;
  longlong local_320;
  longlong lStack_318;
  longlong lStack_310;
  longlong lStack_308;
  longlong local_300;
  longlong lStack_2f8;
  longlong lStack_2f0;
  longlong lStack_2e8;
  longlong local_2e0;
  longlong lStack_2d8;
  longlong lStack_2d0;
  longlong lStack_2c8;
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  longlong local_280;
  longlong lStack_278;
  longlong lStack_270;
  longlong lStack_268;
  longlong local_260;
  longlong lStack_258;
  longlong lStack_250;
  longlong lStack_248;
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong local_220;
  longlong lStack_218;
  longlong lStack_210;
  longlong lStack_208;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  longlong local_1e0;
  longlong lStack_1d8;
  longlong lStack_1d0;
  longlong lStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  longlong local_160;
  longlong lStack_158;
  longlong lStack_150;
  longlong lStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  longlong extraout_RDX;
  __m256i *data_src1;
  __m256i *data_src0;
  
  local_46c = (int)in_R8;
  local_474 = 0x26;
  uVar4 = (uint)(1 << ((byte)w & 0x1f)) >> 1;
  local_442 = (ushort)uVar4;
  auVar1 = vpinsrw_avx(ZEXT216(local_442),uVar4 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,6);
  local_100 = vpinsrw_avx(auVar1,uVar4 & 0xffff,7);
  auVar1 = vpinsrw_avx(ZEXT216(local_442),uVar4 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,6);
  auStack_f0 = vpinsrw_avx(auVar1,uVar4 & 0xffff,7);
  local_4a0 = local_100._0_8_;
  uStack_498 = local_100._8_8_;
  uStack_490 = auStack_f0._0_8_;
  uStack_488 = auStack_f0._8_8_;
  local_444 = 0x26;
  local_82 = 0x26;
  local_84 = 0x26;
  local_86 = 0x26;
  local_88 = 0x26;
  local_8a = 0x26;
  local_8c = 0x26;
  local_8e = 0x26;
  local_90 = 0x26;
  local_92 = 0x26;
  local_94 = 0x26;
  local_96 = 0x26;
  local_98 = 0x26;
  local_9a = 0x26;
  local_9c = 0x26;
  local_9e = 0x26;
  local_a0 = 0x26;
  auVar1 = vpinsrw_avx(ZEXT216(0x26),0x26,1);
  auVar1 = vpinsrw_avx(auVar1,0x26,2);
  auVar1 = vpinsrw_avx(auVar1,0x26,3);
  auVar1 = vpinsrw_avx(auVar1,0x26,4);
  auVar1 = vpinsrw_avx(auVar1,0x26,5);
  auVar1 = vpinsrw_avx(auVar1,0x26,6);
  local_c0 = vpinsrw_avx(auVar1,0x26,7);
  auVar1 = vpinsrw_avx(ZEXT216(0x26),0x26,1);
  auVar1 = vpinsrw_avx(auVar1,0x26,2);
  auVar1 = vpinsrw_avx(auVar1,0x26,3);
  auVar1 = vpinsrw_avx(auVar1,0x26,4);
  auVar1 = vpinsrw_avx(auVar1,0x26,5);
  auVar1 = vpinsrw_avx(auVar1,0x26,6);
  auStack_b0 = vpinsrw_avx(auVar1,0x26,7);
  local_4c0 = local_c0._0_8_;
  uStack_4b8 = local_c0._8_8_;
  uStack_4b0 = auStack_b0._0_8_;
  uStack_4a8 = auStack_b0._8_8_;
  local_446 = 0x40;
  local_32 = 0x40;
  local_34 = 0x40;
  local_36 = 0x40;
  local_38 = 0x40;
  local_3a = 0x40;
  local_3c = 0x40;
  local_3e = 0x40;
  local_40 = 0x40;
  local_42 = 0x40;
  local_44 = 0x40;
  local_46 = 0x40;
  local_48 = 0x40;
  local_4a = 0x40;
  local_4c = 0x40;
  local_4e = 0x40;
  local_50 = 0x40;
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar1 = vpinsrw_avx(auVar1,0x40,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  auVar6 = vpinsrw_avx(auVar6,0x40,7);
  local_4e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar6;
  local_4e0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar17 = ZEXT3264(local_4e0);
  local_4e4 = 0;
  local_470 = in_R9D;
  local_468 = in_RCX;
  local_45c = in_EDX;
  local_458 = in_RSI;
  local_450 = in_RDI;
  local_e0 = local_442;
  local_de = local_442;
  local_dc = local_442;
  local_da = local_442;
  local_d8 = local_442;
  local_d6 = local_442;
  local_d4 = local_442;
  local_d2 = local_442;
  local_d0 = local_442;
  local_ce = local_442;
  local_cc = local_442;
  local_ca = local_442;
  local_c8 = local_442;
  local_c6 = local_442;
  local_c4 = local_442;
  local_c2 = local_442;
  local_80 = local_4e0;
  if (in_stack_00000008 == 4) {
    do {
      auVar6 = auVar17._0_16_;
      xx_loadl_64(local_458);
      local_500 = auVar6;
      xx_loadl_64((void *)((long)*local_458 + (long)local_45c * 2));
      local_510 = auVar6;
      xx_loadl_64((void *)((long)*local_458 + (long)(local_45c * 2) * 2));
      local_520 = auVar6;
      xx_loadl_64((void *)((long)*local_458 + (long)(local_45c * 3) * 2));
      local_530 = auVar6;
      xx_loadl_64(local_468);
      local_540 = auVar6;
      xx_loadl_64((void *)((long)*local_468 + (long)local_46c * 2));
      local_550 = auVar6;
      xx_loadl_64((void *)((long)*local_468 + (long)(local_46c * 2) * 2));
      lVar5 = (long)(local_46c * 3);
      __return_storage_ptr__ = (__m256i *)((long)*local_468 + lVar5 * 2);
      local_560 = auVar6;
      alVar18 = xx_loadl_64(__return_storage_ptr__);
      hi[1] = alVar18[1];
      local_3d0 = local_520._0_8_;
      uStack_3c8 = local_520._8_8_;
      local_3e0 = local_530._0_8_;
      uStack_3d8 = local_530._8_8_;
      auVar1 = vpunpcklqdq_avx(local_520,local_530);
      auVar7 = ZEXT1632(auVar1);
      local_3f0 = local_500._0_8_;
      uStack_3e8 = local_500._8_8_;
      local_400 = local_510._0_8_;
      uStack_3f8 = local_510._8_8_;
      vpunpcklqdq_avx(local_500,local_510);
      alVar18[1] = (longlong)in_R8;
      alVar18[0] = lVar5;
      hi[0] = (longlong)in_RSI;
      local_570 = auVar6;
      yy_set_m128i(__return_storage_ptr__,hi,alVar18);
      local_410 = local_560._0_8_;
      uStack_408 = local_560._8_8_;
      local_420 = local_570._0_8_;
      uStack_418 = local_570._8_8_;
      auVar1 = vpunpcklqdq_avx(local_560,local_570);
      alVar9 = (__m256i)ZEXT1632(auVar1);
      local_430 = local_540._0_8_;
      uStack_428 = local_540._8_8_;
      local_440 = local_550._0_8_;
      uStack_438 = local_550._8_8_;
      vpunpcklqdq_avx(local_540,local_550);
      lo[1] = (longlong)in_R8;
      lo[0] = lVar5;
      hi_00[1] = extraout_RDX;
      hi_00[0] = (longlong)in_RSI;
      local_5a0 = auVar7;
      yy_set_m128i(__return_storage_ptr__,hi_00,lo);
      in_RSI = &local_5c0;
      in_R8 = local_4e0;
      local_5c0 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_5e0[0] = alVar9[0];
      local_5e0[1] = alVar9[1];
      local_5e0[2] = alVar9[2];
      local_5e0[3] = alVar9[3];
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      local_160 = local_5e0[0];
      lStack_158 = local_5e0[1];
      lStack_150 = local_5e0[2];
      lStack_148 = local_5e0[3];
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_600 = vpackuswb_avx2((undefined1  [32])alVar9,ZEXT1632(ZEXT816(0)));
      local_120 = vpermq_avx2(local_600,0xd8);
      auVar17 = ZEXT1664(local_120._0_16_);
      v_00[1] = extraout_RDX_00;
      v_00[0] = (longlong)in_RSI;
      local_5e0 = alVar9;
      xx_storeu_128(local_450,v_00);
      local_458 = (__m256i *)((long)*local_458 + (long)(local_45c << 2) * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)(local_46c << 2) * 2);
      local_450 = (void *)((long)local_450 + 0x10);
      local_4e4 = local_4e4 + 4;
    } while (local_4e4 < local_470);
  }
  else if (in_stack_00000008 == 8) {
    do {
      auVar8 = auVar17._0_32_;
      yy_loadu2_128(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
      local_620 = auVar8;
      yy_loadu2_128(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
      local_640 = auVar8;
      yy_loadu2_128(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
      local_660 = auVar8;
      yy_loadu2_128(in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
      local_680 = auVar8;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_6a0 = auVar8;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_6c0._0_8_ = auVar8._0_8_;
      local_6c0._8_8_ = auVar8._8_8_;
      local_6c0._16_8_ = auVar8._16_8_;
      local_6c0._24_8_ = auVar8._24_8_;
      local_1a0 = local_6a0._0_8_;
      uStack_198 = local_6a0._8_8_;
      uStack_190 = local_6a0._16_8_;
      uStack_188 = local_6a0._24_8_;
      local_1c0 = local_6c0._0_8_;
      uStack_1b8 = local_6c0._8_8_;
      uStack_1b0 = local_6c0._16_8_;
      uStack_1a8 = local_6c0._24_8_;
      local_6e0 = vpackuswb_avx2(local_6a0,auVar8);
      auVar7 = vpermq_avx2(local_6e0,0xd8);
      auVar17 = ZEXT3264(auVar7);
      v[1] = in_stack_fffffffffffff1a0;
      v[0] = 0xa267cd;
      v[2] = in_stack_fffffffffffff1a8;
      v[3] = in_stack_fffffffffffff1b0;
      local_6c0 = auVar8;
      yy_storeu_256(in_stack_fffffffffffff1d0,v);
      local_458 = (__m256i *)((long)*local_458 + (long)(local_45c << 2) * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)(local_46c << 2) * 2);
      local_450 = (void *)((long)local_450 + 0x20);
      local_4e4 = local_4e4 + 4;
    } while (local_4e4 < local_470);
  }
  else if (in_stack_00000008 == 0x10) {
    do {
      alVar9 = auVar17._0_32_;
      yy_loadu_256(local_458,in_RSI);
      local_700 = alVar9;
      yy_loadu_256((__m256i *)((long)*local_458 + (long)local_45c * 2),in_RSI);
      local_720 = alVar9;
      yy_loadu_256(local_468,in_RSI);
      local_740 = alVar9;
      yy_loadu_256((__m256i *)((long)*local_468 + (long)local_46c * 2),in_RSI);
      local_760 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      in_RSI = &local_760;
      local_780 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_7a0[0] = alVar9[0];
      local_7a0[1] = alVar9[1];
      local_7a0[2] = alVar9[2];
      local_7a0[3] = alVar9[3];
      local_1e0 = local_780[0];
      lStack_1d8 = local_780[1];
      lStack_1d0 = local_780[2];
      lStack_1c8 = local_780[3];
      local_200 = local_7a0[0];
      lStack_1f8 = local_7a0[1];
      lStack_1f0 = local_7a0[2];
      lStack_1e8 = local_7a0[3];
      local_7c0 = vpackuswb_avx2((undefined1  [32])local_780,(undefined1  [32])alVar9);
      auVar7 = vpermq_avx2(local_7c0,0xd8);
      auVar17 = ZEXT3264(auVar7);
      alVar10[1] = in_stack_fffffffffffff1a0;
      alVar10[0] = 0xa269a6;
      alVar10[2] = in_stack_fffffffffffff1a8;
      alVar10[3] = in_stack_fffffffffffff1b0;
      local_7a0 = alVar9;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar10);
      local_458 = (__m256i *)((long)*local_458 + (long)(local_45c << 1) * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)(local_46c << 1) * 2);
      local_450 = (void *)((long)local_450 + 0x20);
      local_4e4 = local_4e4 + 2;
    } while (local_4e4 < local_470);
  }
  else if (in_stack_00000008 == 0x20) {
    do {
      alVar9 = auVar17._0_32_;
      yy_loadu_256(local_458,in_RSI);
      local_7e0 = alVar9;
      yy_loadu_256(local_458 + 1,in_RSI);
      local_800 = alVar9;
      yy_loadu_256(local_468,in_RSI);
      local_820 = alVar9;
      yy_loadu_256(local_468 + 1,in_RSI);
      puVar19 = &local_4a0;
      local_840 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      in_RSI = &local_840;
      local_860 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_880[0] = alVar9[0];
      local_880[1] = alVar9[1];
      local_880[2] = alVar9[2];
      local_880[3] = alVar9[3];
      local_220 = local_860[0];
      lStack_218 = local_860[1];
      lStack_210 = local_860[2];
      lStack_208 = local_860[3];
      local_240 = local_880[0];
      lStack_238 = local_880[1];
      lStack_230 = local_880[2];
      lStack_228 = local_880[3];
      local_8a0 = vpackuswb_avx2((undefined1  [32])local_860,(undefined1  [32])alVar9);
      auVar7 = vpermq_avx2(local_8a0,0xd8);
      auVar17 = ZEXT3264(auVar7);
      alVar11[1] = in_stack_fffffffffffff1a0;
      alVar11[0] = 0xa26b6d;
      alVar11[2] = in_stack_fffffffffffff1a8;
      alVar11[3] = in_stack_fffffffffffff1b0;
      local_880 = alVar9;
      yy_storeu_256(puVar19,alVar11);
      local_458 = (__m256i *)((long)*local_458 + (long)local_45c * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)local_46c * 2);
      local_450 = (void *)((long)local_450 + 0x20);
      local_4e4 = local_4e4 + 1;
    } while (local_4e4 < local_470);
  }
  else if (in_stack_00000008 == 0x40) {
    do {
      alVar9 = auVar17._0_32_;
      yy_loadu_256(local_458,in_RSI);
      local_8c0 = alVar9;
      yy_loadu_256(local_458 + 1,in_RSI);
      local_8e0 = alVar9;
      yy_loadu_256(local_458 + 2,in_RSI);
      local_900 = alVar9;
      yy_loadu_256(local_458 + 3,in_RSI);
      local_920 = alVar9;
      yy_loadu_256(local_468,in_RSI);
      local_940 = alVar9;
      yy_loadu_256(local_468 + 1,in_RSI);
      local_960 = alVar9;
      yy_loadu_256(local_468 + 2,in_RSI);
      local_980 = alVar9;
      yy_loadu_256(local_468 + 3,in_RSI);
      local_9a0 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_9c0 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_9e0 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      in_RSI = &local_9a0;
      local_a00 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_260 = local_9c0[0];
      lStack_258 = local_9c0[1];
      lStack_250 = local_9c0[2];
      lStack_248 = local_9c0[3];
      local_280 = local_9e0[0];
      lStack_278 = local_9e0[1];
      lStack_270 = local_9e0[2];
      lStack_268 = local_9e0[3];
      local_a40 = vpackuswb_avx2((undefined1  [32])local_9c0,(undefined1  [32])local_9e0);
      local_a20[0] = alVar9[0];
      local_a20[1] = alVar9[1];
      local_a20[2] = alVar9[2];
      local_a20[3] = alVar9[3];
      local_2a0 = local_a00[0];
      lStack_298 = local_a00[1];
      lStack_290 = local_a00[2];
      lStack_288 = local_a00[3];
      local_2c0 = local_a20[0];
      lStack_2b8 = local_a20[1];
      lStack_2b0 = local_a20[2];
      lStack_2a8 = local_a20[3];
      local_a60 = vpackuswb_avx2((undefined1  [32])local_a00,(undefined1  [32])alVar9);
      vpermq_avx2(local_a40,0xd8);
      alVar16[1] = in_stack_fffffffffffff1a0;
      alVar16[0] = 0xa26e3d;
      alVar16[2] = in_stack_fffffffffffff1a8;
      alVar16[3] = in_stack_fffffffffffff1b0;
      local_a20 = alVar9;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar16);
      auVar7 = vpermq_avx2(local_a60,0xd8);
      auVar17 = ZEXT3264(auVar7);
      alVar15[1] = in_stack_fffffffffffff1a0;
      alVar15[0] = 0xa26e5d;
      alVar15[2] = in_stack_fffffffffffff1a8;
      alVar15[3] = in_stack_fffffffffffff1b0;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar15);
      local_458 = (__m256i *)((long)*local_458 + (long)local_45c * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)local_46c * 2);
      local_450 = (void *)((long)local_450 + 0x40);
      local_4e4 = local_4e4 + 1;
    } while (local_4e4 < local_470);
  }
  else {
    do {
      alVar10 = auVar17._0_32_;
      yy_loadu_256(local_458,in_RSI);
      local_a80 = alVar10;
      yy_loadu_256(local_458 + 1,in_RSI);
      local_aa0 = alVar10;
      yy_loadu_256(local_458 + 2,in_RSI);
      local_ac0 = alVar10;
      yy_loadu_256(local_458 + 3,in_RSI);
      local_ae0 = alVar10;
      yy_loadu_256(local_458 + 4,in_RSI);
      local_b00 = alVar10;
      yy_loadu_256(local_458 + 5,in_RSI);
      local_b20 = alVar10;
      yy_loadu_256(local_458 + 6,in_RSI);
      local_b40 = alVar10;
      yy_loadu_256(local_458 + 7,in_RSI);
      local_b60 = alVar10;
      yy_loadu_256(local_468,in_RSI);
      local_b80 = alVar10;
      yy_loadu_256(local_468 + 1,in_RSI);
      local_ba0 = alVar10;
      yy_loadu_256(local_468 + 2,in_RSI);
      local_bc0 = alVar10;
      yy_loadu_256(local_468 + 3,in_RSI);
      local_be0 = alVar10;
      yy_loadu_256(local_468 + 4,in_RSI);
      local_c00 = alVar10;
      yy_loadu_256(local_468 + 5,in_RSI);
      local_c20 = alVar10;
      yy_loadu_256(local_468 + 6,in_RSI);
      local_c40 = alVar10;
      yy_loadu_256(local_468 + 7,in_RSI);
      puVar19 = &local_4a0;
      puVar20 = &local_4c0;
      puVar21 = local_4e0;
      local_c60 = alVar10;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar11 = alVar10;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar12 = alVar11;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar13 = alVar12;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar14 = alVar13;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar9 = alVar14;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      alVar15 = alVar9;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      in_RSI = &local_c60;
      data_src0 = alVar15[2];
      data_src1 = alVar15[1];
      round_const = alVar15[0];
      alVar16 = alVar15;
      calc_mask_d16_inv_avx2(data_src0,data_src1,round_const,mask_base_16,clip_diff,round);
      local_c80 = alVar10[0];
      lStack_c78 = alVar10[1];
      lStack_c70 = alVar10[2];
      lStack_c68 = alVar10[3];
      local_ca0 = alVar11[0];
      lStack_c98 = alVar11[1];
      lStack_c90 = alVar11[2];
      lStack_c88 = alVar11[3];
      local_2e0 = local_c80;
      lStack_2d8 = lStack_c78;
      lStack_2d0 = lStack_c70;
      lStack_2c8 = lStack_c68;
      local_300 = local_ca0;
      lStack_2f8 = lStack_c98;
      lStack_2f0 = lStack_c90;
      lStack_2e8 = lStack_c88;
      auVar7 = vpackuswb_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar11);
      local_cc0 = alVar12[0];
      lStack_cb8 = alVar12[1];
      lStack_cb0 = alVar12[2];
      lStack_ca8 = alVar12[3];
      local_ce0 = alVar13[0];
      lStack_cd8 = alVar13[1];
      lStack_cd0 = alVar13[2];
      lStack_cc8 = alVar13[3];
      local_320 = local_cc0;
      lStack_318 = lStack_cb8;
      lStack_310 = lStack_cb0;
      lStack_308 = lStack_ca8;
      local_340 = local_ce0;
      lStack_338 = lStack_cd8;
      lStack_330 = lStack_cd0;
      lStack_328 = lStack_cc8;
      auVar8 = vpackuswb_avx2((undefined1  [32])alVar12,(undefined1  [32])alVar13);
      local_d00 = alVar14[0];
      lStack_cf8 = alVar14[1];
      lStack_cf0 = alVar14[2];
      lStack_ce8 = alVar14[3];
      local_d20 = alVar9[0];
      lStack_d18 = alVar9[1];
      lStack_d10 = alVar9[2];
      lStack_d08 = alVar9[3];
      local_360 = local_d00;
      lStack_358 = lStack_cf8;
      lStack_350 = lStack_cf0;
      lStack_348 = lStack_ce8;
      local_380 = local_d20;
      lStack_378 = lStack_d18;
      lStack_370 = lStack_d10;
      lStack_368 = lStack_d08;
      auVar2 = vpackuswb_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar9);
      lStack_d28 = alVar15[3];
      local_d60 = alVar16[0];
      clip_diff = alVar16[2];
      mask_base_16 = alVar16[3];
      lStack_388 = lStack_d28;
      local_3c0 = local_d60;
      auVar3 = vpackuswb_avx2((undefined1  [32])alVar15,(undefined1  [32])alVar16);
      vpermq_avx2(auVar7,0xd8);
      alVar9[1] = (longlong)puVar19;
      alVar9[0] = 0xa27347;
      alVar9[2] = (longlong)puVar20;
      alVar9[3] = (longlong)puVar21;
      lStack_3b8 = alVar16[1];
      lStack_3b0 = (longlong)clip_diff;
      lStack_3a8 = (longlong)mask_base_16;
      local_3a0 = round_const;
      palStack_398 = data_src1;
      palStack_390 = data_src0;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar9);
      vpermq_avx2(auVar8,0xd8);
      alVar14[1] = (longlong)puVar19;
      alVar14[0] = 0xa27367;
      alVar14[2] = (longlong)puVar20;
      alVar14[3] = (longlong)puVar21;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar14);
      vpermq_avx2(auVar2,0xd8);
      alVar13[1] = (longlong)puVar19;
      alVar13[0] = 0xa27387;
      alVar13[2] = (longlong)puVar20;
      alVar13[3] = (longlong)puVar21;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar13);
      auVar7 = vpermq_avx2(auVar3,0xd8);
      auVar17 = ZEXT3264(auVar7);
      alVar12[1] = (longlong)puVar19;
      alVar12[0] = 0xa273a7;
      alVar12[2] = (longlong)puVar20;
      alVar12[3] = (longlong)puVar21;
      yy_storeu_256(in_stack_fffffffffffff1d0,alVar12);
      local_458 = (__m256i *)((long)*local_458 + (long)local_45c * 2);
      local_468 = (__m256i *)((long)*local_468 + (long)local_46c * 2);
      local_450 = (void *)((long)local_450 + 0x80);
      local_4e4 = local_4e4 + 1;
      _local_d60 = alVar16;
      local_d40 = alVar15;
    } while (local_4e4 < local_470);
  }
  return;
}

Assistant:

static inline void build_compound_diffwtd_mask_d16_inv_avx2(
    uint8_t *mask, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, int h, int w, int shift) {
  const int mask_base = 38;
  const __m256i _r = _mm256_set1_epi16((1 << shift) >> 1);
  const __m256i y38 = _mm256_set1_epi16(mask_base);
  const __m256i y64 = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  int i = 0;
  if (w == 4) {
    do {
      const __m128i s0A = xx_loadl_64(src0);
      const __m128i s0B = xx_loadl_64(src0 + src0_stride);
      const __m128i s0C = xx_loadl_64(src0 + src0_stride * 2);
      const __m128i s0D = xx_loadl_64(src0 + src0_stride * 3);
      const __m128i s1A = xx_loadl_64(src1);
      const __m128i s1B = xx_loadl_64(src1 + src1_stride);
      const __m128i s1C = xx_loadl_64(src1 + src1_stride * 2);
      const __m128i s1D = xx_loadl_64(src1 + src1_stride * 3);
      const __m256i s0 = yy_set_m128i(_mm_unpacklo_epi64(s0C, s0D),
                                      _mm_unpacklo_epi64(s0A, s0B));
      const __m256i s1 = yy_set_m128i(_mm_unpacklo_epi64(s1C, s1D),
                                      _mm_unpacklo_epi64(s1A, s1B));
      const __m256i m16 =
          calc_mask_d16_inv_avx2(&s0, &s1, &_r, &y38, &y64, shift);
      const __m256i m8 = _mm256_packus_epi16(m16, _mm256_setzero_si256());
      xx_storeu_128(mask,
                    _mm256_castsi256_si128(_mm256_permute4x64_epi64(m8, 0xd8)));
      src0 += src0_stride << 2;
      src1 += src1_stride << 2;
      mask += 16;
      i += 4;
    } while (i < h);
  } else if (w == 8) {
    do {
      const __m256i s0AB = yy_loadu2_128(src0 + src0_stride, src0);
      const __m256i s0CD =
          yy_loadu2_128(src0 + src0_stride * 3, src0 + src0_stride * 2);
      const __m256i s1AB = yy_loadu2_128(src1 + src1_stride, src1);
      const __m256i s1CD =
          yy_loadu2_128(src1 + src1_stride * 3, src1 + src1_stride * 2);
      const __m256i m16AB =
          calc_mask_d16_inv_avx2(&s0AB, &s1AB, &_r, &y38, &y64, shift);
      const __m256i m16CD =
          calc_mask_d16_inv_avx2(&s0CD, &s1CD, &_r, &y38, &y64, shift);
      const __m256i m8 = _mm256_packus_epi16(m16AB, m16CD);
      yy_storeu_256(mask, _mm256_permute4x64_epi64(m8, 0xd8));
      src0 += src0_stride << 2;
      src1 += src1_stride << 2;
      mask += 32;
      i += 4;
    } while (i < h);
  } else if (w == 16) {
    do {
      const __m256i s0A = yy_loadu_256(src0);
      const __m256i s0B = yy_loadu_256(src0 + src0_stride);
      const __m256i s1A = yy_loadu_256(src1);
      const __m256i s1B = yy_loadu_256(src1 + src1_stride);
      const __m256i m16A =
          calc_mask_d16_inv_avx2(&s0A, &s1A, &_r, &y38, &y64, shift);
      const __m256i m16B =
          calc_mask_d16_inv_avx2(&s0B, &s1B, &_r, &y38, &y64, shift);
      const __m256i m8 = _mm256_packus_epi16(m16A, m16B);
      yy_storeu_256(mask, _mm256_permute4x64_epi64(m8, 0xd8));
      src0 += src0_stride << 1;
      src1 += src1_stride << 1;
      mask += 32;
      i += 2;
    } while (i < h);
  } else if (w == 32) {
    do {
      const __m256i s0A = yy_loadu_256(src0);
      const __m256i s0B = yy_loadu_256(src0 + 16);
      const __m256i s1A = yy_loadu_256(src1);
      const __m256i s1B = yy_loadu_256(src1 + 16);
      const __m256i m16A =
          calc_mask_d16_inv_avx2(&s0A, &s1A, &_r, &y38, &y64, shift);
      const __m256i m16B =
          calc_mask_d16_inv_avx2(&s0B, &s1B, &_r, &y38, &y64, shift);
      const __m256i m8 = _mm256_packus_epi16(m16A, m16B);
      yy_storeu_256(mask, _mm256_permute4x64_epi64(m8, 0xd8));
      src0 += src0_stride;
      src1 += src1_stride;
      mask += 32;
      i += 1;
    } while (i < h);
  } else if (w == 64) {
    do {
      const __m256i s0A = yy_loadu_256(src0);
      const __m256i s0B = yy_loadu_256(src0 + 16);
      const __m256i s0C = yy_loadu_256(src0 + 32);
      const __m256i s0D = yy_loadu_256(src0 + 48);
      const __m256i s1A = yy_loadu_256(src1);
      const __m256i s1B = yy_loadu_256(src1 + 16);
      const __m256i s1C = yy_loadu_256(src1 + 32);
      const __m256i s1D = yy_loadu_256(src1 + 48);
      const __m256i m16A =
          calc_mask_d16_inv_avx2(&s0A, &s1A, &_r, &y38, &y64, shift);
      const __m256i m16B =
          calc_mask_d16_inv_avx2(&s0B, &s1B, &_r, &y38, &y64, shift);
      const __m256i m16C =
          calc_mask_d16_inv_avx2(&s0C, &s1C, &_r, &y38, &y64, shift);
      const __m256i m16D =
          calc_mask_d16_inv_avx2(&s0D, &s1D, &_r, &y38, &y64, shift);
      const __m256i m8AB = _mm256_packus_epi16(m16A, m16B);
      const __m256i m8CD = _mm256_packus_epi16(m16C, m16D);
      yy_storeu_256(mask, _mm256_permute4x64_epi64(m8AB, 0xd8));
      yy_storeu_256(mask + 32, _mm256_permute4x64_epi64(m8CD, 0xd8));
      src0 += src0_stride;
      src1 += src1_stride;
      mask += 64;
      i += 1;
    } while (i < h);
  } else {
    do {
      const __m256i s0A = yy_loadu_256(src0);
      const __m256i s0B = yy_loadu_256(src0 + 16);
      const __m256i s0C = yy_loadu_256(src0 + 32);
      const __m256i s0D = yy_loadu_256(src0 + 48);
      const __m256i s0E = yy_loadu_256(src0 + 64);
      const __m256i s0F = yy_loadu_256(src0 + 80);
      const __m256i s0G = yy_loadu_256(src0 + 96);
      const __m256i s0H = yy_loadu_256(src0 + 112);
      const __m256i s1A = yy_loadu_256(src1);
      const __m256i s1B = yy_loadu_256(src1 + 16);
      const __m256i s1C = yy_loadu_256(src1 + 32);
      const __m256i s1D = yy_loadu_256(src1 + 48);
      const __m256i s1E = yy_loadu_256(src1 + 64);
      const __m256i s1F = yy_loadu_256(src1 + 80);
      const __m256i s1G = yy_loadu_256(src1 + 96);
      const __m256i s1H = yy_loadu_256(src1 + 112);
      const __m256i m16A =
          calc_mask_d16_inv_avx2(&s0A, &s1A, &_r, &y38, &y64, shift);
      const __m256i m16B =
          calc_mask_d16_inv_avx2(&s0B, &s1B, &_r, &y38, &y64, shift);
      const __m256i m16C =
          calc_mask_d16_inv_avx2(&s0C, &s1C, &_r, &y38, &y64, shift);
      const __m256i m16D =
          calc_mask_d16_inv_avx2(&s0D, &s1D, &_r, &y38, &y64, shift);
      const __m256i m16E =
          calc_mask_d16_inv_avx2(&s0E, &s1E, &_r, &y38, &y64, shift);
      const __m256i m16F =
          calc_mask_d16_inv_avx2(&s0F, &s1F, &_r, &y38, &y64, shift);
      const __m256i m16G =
          calc_mask_d16_inv_avx2(&s0G, &s1G, &_r, &y38, &y64, shift);
      const __m256i m16H =
          calc_mask_d16_inv_avx2(&s0H, &s1H, &_r, &y38, &y64, shift);
      const __m256i m8AB = _mm256_packus_epi16(m16A, m16B);
      const __m256i m8CD = _mm256_packus_epi16(m16C, m16D);
      const __m256i m8EF = _mm256_packus_epi16(m16E, m16F);
      const __m256i m8GH = _mm256_packus_epi16(m16G, m16H);
      yy_storeu_256(mask, _mm256_permute4x64_epi64(m8AB, 0xd8));
      yy_storeu_256(mask + 32, _mm256_permute4x64_epi64(m8CD, 0xd8));
      yy_storeu_256(mask + 64, _mm256_permute4x64_epi64(m8EF, 0xd8));
      yy_storeu_256(mask + 96, _mm256_permute4x64_epi64(m8GH, 0xd8));
      src0 += src0_stride;
      src1 += src1_stride;
      mask += 128;
      i += 1;
    } while (i < h);
  }
}